

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

Interval *
tcu::anon_unknown_4::chooseInterval
          (Interval *__return_storage_ptr__,YesNoMaybe choice,Interval *no,Interval *yes)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  double dVar8;
  
  if (choice == YES) {
    __return_storage_ptr__->m_hi = yes->m_hi;
    uVar7 = *(undefined8 *)yes;
    dVar8 = yes->m_lo;
  }
  else {
    if (choice == MAYBE) {
      uVar4 = true;
      if (no->m_hasNaN == false) {
        uVar4 = (undefined1)*(undefined4 *)yes;
      }
      dVar8 = no->m_lo;
      dVar1 = no->m_hi;
      dVar2 = yes->m_lo;
      dVar3 = yes->m_hi;
      uVar5 = -(ulong)(dVar8 <= dVar2);
      uVar6 = -(ulong)(dVar3 <= dVar1);
      __return_storage_ptr__->m_hasNaN = (bool)uVar4;
      __return_storage_ptr__->m_lo = (double)(~uVar5 & (ulong)dVar2 | (ulong)dVar8 & uVar5);
      __return_storage_ptr__->m_hi = (double)(~uVar6 & (ulong)dVar3 | (ulong)dVar1 & uVar6);
      return __return_storage_ptr__;
    }
    if (choice != NO) {
      __return_storage_ptr__->m_hasNaN = false;
      __return_storage_ptr__->m_lo = INFINITY;
      __return_storage_ptr__->m_hi = -INFINITY;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->m_hi = no->m_hi;
    uVar7 = *(undefined8 *)no;
    dVar8 = no->m_lo;
  }
  *(undefined8 *)__return_storage_ptr__ = uVar7;
  __return_storage_ptr__->m_lo = dVar8;
  return __return_storage_ptr__;
}

Assistant:

Interval chooseInterval(YesNoMaybe choice, const Interval& no, const Interval& yes)
{
	switch (choice)
	{
		case NO:	return no;
		case YES:	return yes;
		case MAYBE:	return no | yes;
		default:	DE_FATAL("Impossible case");
	}

	return Interval();
}